

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

ExecutionResult *
fold(ExecutionResult *__return_storage_ptr__,
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l,
    longlong start,_func_longlong_longlong_longlong *llf,_func_double_double_double *df,
    bool start_with_first)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  eval_error *this;
  _List_node_base *p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  double local_110;
  double d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  shared_ptr<SchemeObject> i;
  longlong n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_110 = (double)start;
  bVar2 = false;
  p_Var4 = (_List_node_base *)l;
  do {
    p_Var4 = (((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)l) {
      if (bVar2) {
        std::make_shared<SchemeFloat,double&>((double *)&i);
      }
      else {
        std::make_shared<SchemeInt,long_long&>((longlong *)&i);
      }
      local_98._M_dataplus._M_p =
           (pointer)i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98._M_string_length =
           (size_type)
           i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                 (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
      ExecutionResult::ExecutionResult(__return_storage_ptr__,(shared_ptr<SchemeObject> *)&local_f8)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1));
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
    bVar3 = is_int((shared_ptr<SchemeObject> *)&local_70);
    if (bVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    }
    else {
      std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
      bVar3 = is_float((shared_ptr<SchemeObject> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      if (!bVar3) {
        this = (eval_error *)__cxa_allocate_exception(0x10);
        (*(i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_SchemeObject[2])(&local_98);
        std::operator+(&local_f8,&local_98," is not an number");
        eval_error::runtime_error(this,&local_f8);
        __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((start_with_first & 1U) == 0) {
      std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
      bVar3 = is_float((shared_ptr<SchemeObject> *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      if (!bVar3) {
        if (bVar2) {
          std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
          local_110 = (*df)(local_110,(double)*(long *)(local_f8._M_dataplus._M_p + 8));
        }
        else {
          std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
          start = (*llf)(start,*(longlong *)(local_f8._M_dataplus._M_p + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
          std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
          local_110 = (*df)(local_110,(double)*(long *)(local_f8._M_dataplus._M_p + 8));
        }
        goto LAB_0013051e;
      }
      std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
      dVar1 = (*df)(local_110,*(double *)(local_f8._M_dataplus._M_p + 8));
      uVar5 = SUB84(dVar1,0);
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_0013046d:
      local_110 = (double)CONCAT44(uVar6,uVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
      bVar2 = true;
    }
    else {
      std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
      bVar3 = is_float((shared_ptr<SchemeObject> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if (bVar3) {
        std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
        uVar5 = (undefined4)*(undefined8 *)(local_f8._M_dataplus._M_p + 8);
        uVar6 = (undefined4)((ulong)*(undefined8 *)(local_f8._M_dataplus._M_p + 8) >> 0x20);
        goto LAB_0013046d;
      }
      std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_f8);
      start = *(longlong *)(local_f8._M_dataplus._M_p + 8);
      local_110 = (double)start;
LAB_0013051e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    start_with_first = false;
  } while( true );
}

Assistant:

static ExecutionResult fold(const std::list<std::shared_ptr<SchemeObject>> &l, long long start,
                            long long (*llf)(long long, long long), double (*df)(double, double),
                            bool start_with_first = false)
{
    long long n = start;
    double d = start;
    bool is_double = false;
    for(auto i : l)
    {
        if(!is_int(i) && !is_float(i))
        {
            throw eval_error(i->external_repr() + " is not an number");
        }
        if(start_with_first)
        {
            if(is_float(i))
            {
                is_double = true;
                d = std::dynamic_pointer_cast<SchemeFloat>(i)->value;
            }
            else
            {
                d = n = std::dynamic_pointer_cast<SchemeInt>(i)->value;
            }
            start_with_first = false;
            continue;
        }
        if(is_float(i))
        {
            is_double = true;
            d = df(d, std::dynamic_pointer_cast<SchemeFloat>(i)->value);
        }
        else if(is_double)
        {
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
        else
        {
            n = llf(n, std::dynamic_pointer_cast<SchemeInt>(i)->value);
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
    }
    if(is_double)
        return to_object(std::make_shared<SchemeFloat>(d));
    else
        return to_object(std::make_shared<SchemeInt>(n));
}